

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

ClippedEdge *
MutableS2ShapeIndex::ClipVBound(ClippedEdge *edge,int v_end,double v,EdgeAllocator *alloc)

{
  FaceEdge *pFVar1;
  double dVar2;
  double dVar3;
  ClippedEdge *pCVar4;
  double dVar5;
  double dVar6;
  S2LogMessage local_30;
  
  if (v_end == 0) {
    if (v <= (edge->bound).bounds_[1].bounds_.c_[0]) {
      return edge;
    }
  }
  else if ((edge->bound).bounds_[1].bounds_.c_[1] <= v) {
    return edge;
  }
  pFVar1 = edge->face_edge;
  dVar6 = (pFVar1->a).c_[0];
  dVar2 = (pFVar1->a).c_[1];
  dVar5 = (pFVar1->b).c_[0];
  dVar3 = (pFVar1->b).c_[1];
  if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.h"
               ,0xab,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (a) != (b) ",0x19);
    abort();
  }
  if (ABS(dVar2 - v) <= ABS(dVar3 - v)) {
    dVar5 = ((v - dVar2) * (dVar5 - dVar6)) / (dVar3 - dVar2) + dVar6;
  }
  else {
    dVar5 = ((v - dVar3) * (dVar6 - dVar5)) / (dVar2 - dVar3) + dVar5;
  }
  dVar6 = R1Interval::Project((edge->bound).bounds_,dVar5);
  pCVar4 = UpdateBound(edge,-(uint)((pFVar1->b).c_[0] < (pFVar1->a).c_[0] !=
                                   (pFVar1->b).c_[1] < (pFVar1->a).c_[1]) & 1 ^ v_end,dVar6,v_end,v,
                       alloc);
  return pCVar4;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipVBound(const ClippedEdge* edge, int v_end, double v,
                                EdgeAllocator* alloc) {
  // See comments in ClipUBound.
  if (v_end == 0) {
    if (edge->bound[1].lo() >= v) return edge;
  } else {
    if (edge->bound[1].hi() <= v) return edge;
  }
  const FaceEdge& e = *edge->face_edge;
  double u = edge->bound[0].Project(
      S2::InterpolateDouble(v, e.a[1], e.b[1], e.a[0], e.b[0]));
  int u_end = v_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}